

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Selectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 *size_arg)

{
  ImVec2 p_min;
  ImGuiContext *pIVar1;
  byte bVar2;
  ImGuiID id_00;
  ImGuiWindow *pIVar3;
  float *in_RCX;
  uint in_EDX;
  byte in_SIL;
  bool bVar4;
  float fVar5;
  ImVec2 IVar6;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  bool was_selected;
  ImGuiButtonFlags button_flags;
  ImGuiItemFlags backup_item_flags;
  bool item_add;
  float backup_clip_rect_max_x;
  float backup_clip_rect_min_x;
  float spacing_U;
  float spacing_L;
  float spacing_y;
  float spacing_x;
  ImRect bb;
  ImVec2 text_max;
  ImVec2 text_min;
  float max_x;
  float min_x;
  bool span_all_columns;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  float idx;
  float in_stack_ffffffffffffff28;
  float fVar7;
  undefined4 in_stack_ffffffffffffff2c;
  float _y;
  undefined4 in_stack_ffffffffffffff30;
  float fVar8;
  undefined4 in_stack_ffffffffffffff34;
  float id_01;
  ImRect *bb_00;
  ImVec2 *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  ImU32 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff59;
  byte in_stack_ffffffffffffff5a;
  byte bVar9;
  uint uVar10;
  ImGuiItemFlags in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ImGuiID id_02;
  float fVar11;
  float fVar12;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float local_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  ImVec2 local_70;
  float fVar13;
  undefined1 border;
  float fVar14;
  undefined4 in_stack_ffffffffffffffa8;
  float fVar15;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float lhs;
  float fVar16;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    bb_00 = (ImRect *)0x0;
    id_00 = ImGuiWindow::GetID((ImGuiWindow *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                               ,(char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20
                                                ));
    IVar6 = CalcTextSize((char *)bb_00,
                         (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0),in_stack_ffffffffffffff28)
    ;
    lhs = IVar6.x;
    fVar16 = IVar6.y;
    if ((*in_RCX != 0.0) || (fVar8 = lhs, NAN(*in_RCX))) {
      fVar8 = *in_RCX;
    }
    if ((in_RCX[1] != 0.0) || (_y = fVar16, NAN(in_RCX[1]))) {
      _y = in_RCX[1];
    }
    id_01 = fVar8;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,fVar8,_y);
    IVar6 = (pIVar3->DC).CursorPos;
    fVar15 = IVar6.x;
    fVar5 = (pIVar3->DC).CurrLineTextBaseOffset + IVar6.y;
    ItemSize((ImVec2 *)CONCAT44(id_01,fVar8),_y);
    bVar4 = (in_EDX & 2) != 0;
    fVar8 = (float)CONCAT13(bVar4,(int3)in_stack_ffffffffffffffa8);
    if (bVar4) {
      idx = (pIVar3->ParentWorkRect).Max.x;
      fVar7 = (pIVar3->ParentWorkRect).Min.x;
    }
    else {
      idx = (pIVar3->WorkRect).Max.x;
      fVar7 = fVar15;
    }
    fVar13 = idx;
    fVar14 = fVar7;
    if (((*in_RCX == 0.0) && (!NAN(*in_RCX))) || ((in_EDX & 0x800000) != 0)) {
      in_stack_ffffffffffffffb4 = ImMax<float>(lhs,idx - fVar7);
    }
    border = (undefined1)((uint)fVar13 >> 0x18);
    fVar13 = fVar5;
    ImVec2::ImVec2(&local_70,fVar14 + in_stack_ffffffffffffffb4,fVar5 + in_stack_ffffffffffffffb8);
    ImRect::ImRect((ImRect *)CONCAT44(idx,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c,
                   in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    if ((in_EDX & 0x4000000) == 0) {
      if (((uint)fVar8 & 0x1000000) == 0) {
        in_stack_ffffffffffffff20 = (pIVar1->Style).ItemSpacing.x;
      }
      else {
        in_stack_ffffffffffffff20 = 0.0;
      }
      fVar12 = (pIVar1->Style).ItemSpacing.y;
      in_stack_ffffffffffffff74 = (float)(int)(in_stack_ffffffffffffff20 * 0.5);
      in_stack_ffffffffffffff70 = (float)(int)(fVar12 * 0.5);
      local_80 = local_80 - in_stack_ffffffffffffff74;
      fStack_7c = fStack_7c - in_stack_ffffffffffffff70;
      local_78 = (in_stack_ffffffffffffff20 - in_stack_ffffffffffffff74) + local_78;
      fStack_74 = (fVar12 - in_stack_ffffffffffffff70) + fStack_74;
    }
    fVar12 = (pIVar3->ClipRect).Min.x;
    fVar11 = (pIVar3->ClipRect).Max.x;
    if (((uint)fVar8 & 0x1000000) != 0) {
      (pIVar3->ClipRect).Min.x = (pIVar3->ParentWorkRect).Min.x;
      (pIVar3->ClipRect).Max.x = (pIVar3->ParentWorkRect).Max.x;
    }
    if ((in_EDX & 8) == 0) {
      bVar4 = ItemAdd(bb_00,(ImGuiID)id_01,(ImRect *)CONCAT44(_y,fVar7));
      id_02 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffff64);
    }
    else {
      in_stack_ffffffffffffff60 = (pIVar3->DC).ItemFlags;
      (pIVar3->DC).ItemFlags = (pIVar3->DC).ItemFlags | 0x14;
      bVar4 = ItemAdd(bb_00,(ImGuiID)id_01,(ImRect *)CONCAT44(_y,fVar7));
      id_02 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffff64);
      (pIVar3->DC).ItemFlags = in_stack_ffffffffffffff60;
    }
    if (((uint)fVar8 & 0x1000000) != 0) {
      (pIVar3->ClipRect).Min.x = fVar12;
      (pIVar3->ClipRect).Max.x = fVar11;
    }
    if ((char)(id_02 >> 0x18) == '\0') {
      local_1 = false;
    }
    else {
      if ((((uint)fVar8 & 0x1000000) == 0) ||
         ((pIVar3->DC).CurrentColumns == (ImGuiOldColumns *)0x0)) {
        if ((((uint)fVar8 & 0x1000000) != 0) && (pIVar1->CurrentTable != (ImGuiTable *)0x0)) {
          TablePushBackgroundChannel();
        }
      }
      else {
        PushColumnsBackground();
      }
      uVar10 = 0;
      if ((in_EDX & 0x100000) != 0) {
        uVar10 = 0x20000;
      }
      if ((in_EDX & 0x200000) != 0) {
        uVar10 = uVar10 | 0x10;
      }
      if ((in_EDX & 0x400000) != 0) {
        uVar10 = uVar10 | 0x80;
      }
      if ((in_EDX & 8) != 0) {
        uVar10 = uVar10 | 0x4000;
      }
      if ((in_EDX & 4) != 0) {
        uVar10 = uVar10 | 0x120;
      }
      if ((in_EDX & 0x10) != 0) {
        uVar10 = uVar10 | 0x1000;
      }
      if ((in_EDX & 8) != 0) {
        local_11 = 0;
      }
      bVar9 = local_11;
      bVar2 = ButtonBehavior((ImRect *)CONCAT44(fVar12,fVar11),id_02,
                             (bool *)CONCAT44(uVar10,CONCAT13(local_11,CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  CONCAT11(in_stack_ffffffffffffff59,
                                                           in_stack_ffffffffffffff58)))),
                             (bool *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             (ImGuiButtonFlags)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      if ((((bool)bVar2) || (((in_stack_ffffffffffffff5a & 1) != 0 && ((in_EDX & 0x2000000) != 0))))
         && (((pIVar1->NavDisableMouseHover & 1U) == 0 &&
             ((pIVar1->NavWindow == pIVar3 && (pIVar1->NavLayer == (pIVar3->DC).NavLayerCurrent)))))
         ) {
        pIVar1->NavDisableHighlight = true;
        SetNavID(id_00,(pIVar3->DC).NavLayerCurrent,(pIVar3->DC).NavFocusScopeIdCurrent);
      }
      if ((bVar2 & 1) != 0) {
        MarkItemEdited(id_00);
      }
      if ((in_EDX & 0x10) != 0) {
        SetItemAllowOverlap();
      }
      if (local_11 != (bVar9 & 1)) {
        (pIVar3->DC).LastItemStatusFlags = (pIVar3->DC).LastItemStatusFlags | 8;
      }
      if (((in_stack_ffffffffffffff59 & 1) != 0) && ((in_EDX & 0x1000000) != 0)) {
        in_stack_ffffffffffffff5a = 1;
      }
      if (((in_stack_ffffffffffffff5a & 1) != 0) || (local_11 != 0)) {
        in_stack_ffffffffffffff54 = GetColorU32((ImGuiCol)idx,in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff48 = (char *)CONCAT44(fStack_7c,local_80);
        in_stack_ffffffffffffff40 = (ImVec2 *)CONCAT44(fStack_74,local_78);
        p_min.y = in_stack_ffffffffffffffb4;
        p_min.x = fVar5;
        IVar6.y = fVar15;
        IVar6.x = fVar8;
        RenderFrame(p_min,IVar6,(ImU32)fVar14,(bool)border,fVar13);
        RenderNavHighlight((ImRect *)CONCAT44(id_00,fVar16),(ImGuiID)lhs,
                           (ImGuiNavHighlightFlags)in_stack_ffffffffffffffb8);
      }
      if ((((uint)fVar8 & 0x1000000) == 0) ||
         ((pIVar3->DC).CurrentColumns == (ImGuiOldColumns *)0x0)) {
        if ((((uint)fVar8 & 0x1000000) != 0) && (pIVar1->CurrentTable != (ImGuiTable *)0x0)) {
          TablePopBackgroundChannel();
        }
      }
      else {
        PopColumnsBackground();
      }
      if ((in_EDX & 8) != 0) {
        PushStyleColor((ImGuiCol)id_01,(ImVec4 *)CONCAT44(_y,fVar7));
      }
      RenderTextClipped((ImVec2 *)CONCAT44(id_02,in_stack_ffffffffffffff60),
                        (ImVec2 *)
                        CONCAT44(uVar10,CONCAT13(bVar9,CONCAT12(in_stack_ffffffffffffff5a,
                                                                CONCAT11(in_stack_ffffffffffffff59,
                                                                         bVar2)))),
                        (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,&bb_00->Min,
                        (ImRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if ((in_EDX & 8) != 0) {
        PopStyleColor((int)in_stack_ffffffffffffff14);
      }
      if (((((bVar2 & 1) != 0) && ((pIVar3->Flags & 0x4000000U) != 0)) && ((in_EDX & 1) == 0)) &&
         (((pIVar3->DC).ItemFlags & 0x20U) == 0)) {
        CloseCurrentPopup();
      }
      local_1 = (bool)(bVar2 & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Selectable(const char* label, bool selected, ImGuiSelectableFlags flags, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    // Submit label or explicit size to ItemSize(), whereas ItemAdd() will submit a larger/spanning rectangle.
    ImGuiID id = window->GetID(label);
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size(size_arg.x != 0.0f ? size_arg.x : label_size.x, size_arg.y != 0.0f ? size_arg.y : label_size.y);
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrLineTextBaseOffset;
    ItemSize(size, 0.0f);

    // Fill horizontal space
    // We don't support (size < 0.0f) in Selectable() because the ItemSpacing extension would make explicitly right-aligned sizes not visibly match other widgets.
    const bool span_all_columns = (flags & ImGuiSelectableFlags_SpanAllColumns) != 0;
    const float min_x = span_all_columns ? window->ParentWorkRect.Min.x : pos.x;
    const float max_x = span_all_columns ? window->ParentWorkRect.Max.x : window->WorkRect.Max.x;
    if (size_arg.x == 0.0f || (flags & ImGuiSelectableFlags_SpanAvailWidth))
        size.x = ImMax(label_size.x, max_x - min_x);

    // Text stays at the submission position, but bounding box may be extended on both sides
    const ImVec2 text_min = pos;
    const ImVec2 text_max(min_x + size.x, pos.y + size.y);

    // Selectables are meant to be tightly packed together with no click-gap, so we extend their box to cover spacing between selectable.
    ImRect bb(min_x, pos.y, text_max.x, text_max.y);
    if ((flags & ImGuiSelectableFlags_NoPadWithHalfSpacing) == 0)
    {
        const float spacing_x = span_all_columns ? 0.0f : style.ItemSpacing.x;
        const float spacing_y = style.ItemSpacing.y;
        const float spacing_L = IM_FLOOR(spacing_x * 0.50f);
        const float spacing_U = IM_FLOOR(spacing_y * 0.50f);
        bb.Min.x -= spacing_L;
        bb.Min.y -= spacing_U;
        bb.Max.x += (spacing_x - spacing_L);
        bb.Max.y += (spacing_y - spacing_U);
    }
    //if (g.IO.KeyCtrl) { GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(0, 255, 0, 255)); }

    // Modify ClipRect for the ItemAdd(), faster than doing a PushColumnsBackground/PushTableBackground for every Selectable..
    const float backup_clip_rect_min_x = window->ClipRect.Min.x;
    const float backup_clip_rect_max_x = window->ClipRect.Max.x;
    if (span_all_columns)
    {
        window->ClipRect.Min.x = window->ParentWorkRect.Min.x;
        window->ClipRect.Max.x = window->ParentWorkRect.Max.x;
    }

    bool item_add;
    if (flags & ImGuiSelectableFlags_Disabled)
    {
        ImGuiItemFlags backup_item_flags = window->DC.ItemFlags;
        window->DC.ItemFlags |= ImGuiItemFlags_Disabled | ImGuiItemFlags_NoNavDefaultFocus;
        item_add = ItemAdd(bb, id);
        window->DC.ItemFlags = backup_item_flags;
    }
    else
    {
        item_add = ItemAdd(bb, id);
    }

    if (span_all_columns)
    {
        window->ClipRect.Min.x = backup_clip_rect_min_x;
        window->ClipRect.Max.x = backup_clip_rect_max_x;
    }

    if (!item_add)
        return false;

    // FIXME: We can standardize the behavior of those two, we could also keep the fast path of override ClipRect + full push on render only,
    // which would be advantageous since most selectable are not selected.
    if (span_all_columns && window->DC.CurrentColumns)
        PushColumnsBackground();
    else if (span_all_columns && g.CurrentTable)
        TablePushBackgroundChannel();

    // We use NoHoldingActiveID on menus so user can click and _hold_ on a menu then drag to browse child entries
    ImGuiButtonFlags button_flags = 0;
    if (flags & ImGuiSelectableFlags_NoHoldingActiveID) { button_flags |= ImGuiButtonFlags_NoHoldingActiveId; }
    if (flags & ImGuiSelectableFlags_SelectOnClick)     { button_flags |= ImGuiButtonFlags_PressedOnClick; }
    if (flags & ImGuiSelectableFlags_SelectOnRelease)   { button_flags |= ImGuiButtonFlags_PressedOnRelease; }
    if (flags & ImGuiSelectableFlags_Disabled)          { button_flags |= ImGuiButtonFlags_Disabled; }
    if (flags & ImGuiSelectableFlags_AllowDoubleClick)  { button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick; }
    if (flags & ImGuiSelectableFlags_AllowItemOverlap)  { button_flags |= ImGuiButtonFlags_AllowItemOverlap; }

    if (flags & ImGuiSelectableFlags_Disabled)
        selected = false;

    const bool was_selected = selected;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);

    // Update NavId when clicking or when Hovering (this doesn't happen on most widgets), so navigation can be resumed with gamepad/keyboard
    if (pressed || (hovered && (flags & ImGuiSelectableFlags_SetNavIdOnHover)))
    {
        if (!g.NavDisableMouseHover && g.NavWindow == window && g.NavLayer == window->DC.NavLayerCurrent)
        {
            g.NavDisableHighlight = true;
            SetNavID(id, window->DC.NavLayerCurrent, window->DC.NavFocusScopeIdCurrent);
        }
    }
    if (pressed)
        MarkItemEdited(id);

    if (flags & ImGuiSelectableFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, Selectable() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    if (held && (flags & ImGuiSelectableFlags_DrawHoveredWhenHeld))
        hovered = true;
    if (hovered || selected)
    {
        const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }

    if (span_all_columns && window->DC.CurrentColumns)
        PopColumnsBackground();
    else if (span_all_columns && g.CurrentTable)
        TablePopBackgroundChannel();

    if (flags & ImGuiSelectableFlags_Disabled) PushStyleColor(ImGuiCol_Text, style.Colors[ImGuiCol_TextDisabled]);
    RenderTextClipped(text_min, text_max, label, NULL, &label_size, style.SelectableTextAlign, &bb);
    if (flags & ImGuiSelectableFlags_Disabled) PopStyleColor();

    // Automatically close popups
    if (pressed && (window->Flags & ImGuiWindowFlags_Popup) && !(flags & ImGuiSelectableFlags_DontClosePopups) && !(window->DC.ItemFlags & ImGuiItemFlags_SelectableDontClosePopup))
        CloseCurrentPopup();

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return pressed;
}